

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setup_connection_internals(Curl_easy *data,connectdata *conn)

{
  CURLcode CVar1;
  char *pcVar2;
  size_t sVar3;
  uint local_34;
  CURLcode result;
  int port;
  char *hostname;
  Curl_handler *p;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  hostname = (char *)conn->handler;
  if (((Curl_handler *)hostname)->setup_connection !=
      (_func_CURLcode_Curl_easy_ptr_connectdata_ptr *)0x0) {
    CVar1 = (*((Curl_handler *)hostname)->setup_connection)(data,conn);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    hostname = (char *)conn->handler;
  }
  if ((conn->primary).remote_port < 0) {
    (conn->primary).remote_port = *(int *)(hostname + 0x88);
  }
  if ((((ulong)conn->bits & 1) == 0) || (((ulong)conn->bits >> 3 & 1) != 0)) {
    local_34 = conn->remote_port;
    if (((ulong)conn->bits >> 8 & 1) == 0) {
      _result = (conn->host).name;
    }
    else {
      _result = (conn->conn_to_host).name;
    }
  }
  else {
    _result = (conn->http_proxy).host.name;
    local_34 = (conn->primary).remote_port;
  }
  pcVar2 = curl_maprintf("%u/%d/%s",(ulong)conn->scope_id,(ulong)local_34,_result);
  conn->destination = pcVar2;
  if (conn->destination == (char *)0x0) {
    data_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    sVar3 = strlen(conn->destination);
    conn->destination_len = sVar3 + 1;
    Curl_strntolower(conn->destination,conn->destination,conn->destination_len - 1);
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode setup_connection_internals(struct Curl_easy *data,
                                           struct connectdata *conn)
{
  const struct Curl_handler *p;
  const char *hostname;
  int port;
  CURLcode result;

  /* Perform setup complement if some. */
  p = conn->handler;

  if(p->setup_connection) {
    result = (*p->setup_connection)(data, conn);

    if(result)
      return result;

    p = conn->handler;              /* May have changed. */
  }

  if(conn->primary.remote_port < 0)
    /* we check for -1 here since if proxy was detected already, this
       was very likely already set to the proxy port */
    conn->primary.remote_port = p->defport;

  /* Now create the destination name */
#ifndef CURL_DISABLE_PROXY
  if(conn->bits.httpproxy && !conn->bits.tunnel_proxy) {
    hostname = conn->http_proxy.host.name;
    port = conn->primary.remote_port;
  }
  else
#endif
  {
    port = conn->remote_port;
    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;
  }

#ifdef USE_IPV6
  conn->destination = aprintf("%u/%d/%s", conn->scope_id, port, hostname);
#else
  conn->destination = aprintf("%d/%s", port, hostname);
#endif
  if(!conn->destination)
    return CURLE_OUT_OF_MEMORY;

  conn->destination_len = strlen(conn->destination) + 1;
  Curl_strntolower(conn->destination, conn->destination,
                   conn->destination_len - 1);

  return CURLE_OK;
}